

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O2

HighsDebugStatus
debugHighsSolution(string *message,HighsOptions *options,HighsModel *model,HighsSolution *solution,
                  HighsBasis *basis)

{
  HighsDebugStatus HVar1;
  HighsModelStatus dummy_model_status;
  string local_108;
  HighsInfo dummy_highs_info;
  
  HighsInfo::HighsInfo(&dummy_highs_info);
  resetModelStatusAndHighsInfo(&dummy_model_status,&dummy_highs_info);
  std::__cxx11::string::string((string *)&local_108,(string *)message);
  HVar1 = debugHighsSolution(&local_108,options,&model->lp_,&model->hessian_,solution,basis,
                             dummy_model_status,&dummy_highs_info,false);
  std::__cxx11::string::~string((string *)&local_108);
  HighsInfo::~HighsInfo(&dummy_highs_info);
  return HVar1;
}

Assistant:

HighsDebugStatus debugHighsSolution(const string message,
                                    const HighsOptions& options,
                                    const HighsModel& model,
                                    const HighsSolution& solution,
                                    const HighsBasis& basis) {
  // Non-trivially expensive analysis of a solution to a model
  //
  // Called to report on KKT errors after solving a model when only
  // the solution (possibly only primal) and (possibly) basis are
  // known
  //
  // Set up a HighsModelStatus and HighsInfo just to
  // complete the parameter list.By setting
  // check_model_status_and_highs_info to be false they aren't
  // used.
  HighsModelStatus dummy_model_status;
  HighsInfo dummy_highs_info;
  // Call resetModelStatusAndSolutionParams to side-step compiler
  // warning.
  resetModelStatusAndHighsInfo(dummy_model_status, dummy_highs_info);
  const bool check_model_status_and_highs_info = false;
  return debugHighsSolution(
      message, options, model.lp_, model.hessian_, solution, basis,
      dummy_model_status, dummy_highs_info, check_model_status_and_highs_info);
}